

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O0

void icu_63::initDangiCalZoneAstroCalc(void)

{
  UBool UVar1;
  InitialTimeZoneRule *this;
  TimeArrayTimeZoneRule *pTVar2;
  RuleBasedTimeZone *this_00;
  UnicodeString *in_RSI;
  RuleBasedTimeZone *local_290;
  TimeArrayTimeZoneRule *local_278;
  TimeArrayTimeZoneRule *local_260;
  TimeArrayTimeZoneRule *local_248;
  InitialTimeZoneRule *local_230;
  ConstChar16Ptr local_220;
  UnicodeString local_218;
  undefined1 local_1d1;
  RuleBasedTimeZone *local_1d0;
  RuleBasedTimeZone *local_1c8;
  RuleBasedTimeZone *dangiCalZoneAstroCalc;
  UErrorCode status;
  UnicodeString local_1b0;
  undefined1 local_169;
  TimeArrayTimeZoneRule *local_168;
  TimeArrayTimeZoneRule *local_160;
  TimeZoneRule *ruleFrom1912;
  ConstChar16Ptr local_150;
  UnicodeString local_148;
  undefined1 local_101;
  TimeArrayTimeZoneRule *local_100;
  TimeArrayTimeZoneRule *local_f8;
  TimeZoneRule *rule1898to1911;
  ConstChar16Ptr local_e8;
  UnicodeString local_e0;
  undefined1 local_99;
  TimeArrayTimeZoneRule *local_98;
  TimeArrayTimeZoneRule *local_90;
  TimeZoneRule *rule1897;
  ConstChar16Ptr local_78;
  UnicodeString local_70;
  undefined1 local_29;
  InitialTimeZoneRule *local_28;
  InitialTimeZoneRule *initialTimeZone;
  UDate millis1912 [1];
  UDate millis1898 [1];
  UDate millis1897 [1];
  
  millis1898[0] = -2302128000000.0;
  millis1912[0] = -2270592000000.0;
  initialTimeZone = (InitialTimeZoneRule *)0xc27a9de23f800000;
  this = (InitialTimeZoneRule *)UMemory::operator_new((UMemory *)0x50,(size_t)in_RSI);
  rule1897._3_1_ = 0;
  rule1897._2_1_ = 0;
  local_230 = (InitialTimeZoneRule *)0x0;
  if (this != (InitialTimeZoneRule *)0x0) {
    local_29 = 1;
    ConstChar16Ptr::ConstChar16Ptr(&local_78,L"GMT+8");
    rule1897._3_1_ = 1;
    UnicodeString::UnicodeString(&local_70,'\x01',&local_78,-1);
    rule1897._2_1_ = 1;
    in_RSI = &local_70;
    InitialTimeZoneRule::InitialTimeZoneRule(this,in_RSI,28800000,0);
    local_230 = this;
  }
  local_29 = 0;
  if ((rule1897._2_1_ & 1) != 0) {
    UnicodeString::~UnicodeString(&local_70);
  }
  if ((rule1897._3_1_ & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_78);
  }
  local_28 = local_230;
  pTVar2 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  rule1898to1911._7_1_ = 0;
  rule1898to1911._6_1_ = 0;
  local_248 = (TimeArrayTimeZoneRule *)0x0;
  if (pTVar2 != (TimeArrayTimeZoneRule *)0x0) {
    local_99 = 1;
    local_98 = pTVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_e8,L"Korean 1897");
    rule1898to1911._7_1_ = 1;
    UnicodeString::UnicodeString(&local_e0,'\x01',&local_e8,-1);
    rule1898to1911._6_1_ = 1;
    in_RSI = &local_e0;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (pTVar2,in_RSI,25200000,0,millis1898,1,STANDARD_TIME);
    local_248 = pTVar2;
  }
  local_99 = 0;
  if ((rule1898to1911._6_1_ & 1) != 0) {
    UnicodeString::~UnicodeString(&local_e0);
  }
  if ((rule1898to1911._7_1_ & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_e8);
  }
  local_90 = local_248;
  pTVar2 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  ruleFrom1912._7_1_ = 0;
  ruleFrom1912._6_1_ = 0;
  local_260 = (TimeArrayTimeZoneRule *)0x0;
  if (pTVar2 != (TimeArrayTimeZoneRule *)0x0) {
    local_101 = 1;
    local_100 = pTVar2;
    ConstChar16Ptr::ConstChar16Ptr(&local_150,L"Korean 1898-1911");
    ruleFrom1912._7_1_ = 1;
    UnicodeString::UnicodeString(&local_148,'\x01',&local_150,-1);
    ruleFrom1912._6_1_ = 1;
    in_RSI = &local_148;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (pTVar2,in_RSI,28800000,0,millis1912,1,STANDARD_TIME);
    local_260 = pTVar2;
  }
  local_101 = 0;
  if ((ruleFrom1912._6_1_ & 1) != 0) {
    UnicodeString::~UnicodeString(&local_148);
  }
  if ((ruleFrom1912._7_1_ & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_150);
  }
  local_f8 = local_260;
  pTVar2 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  dangiCalZoneAstroCalc._7_1_ = 0;
  dangiCalZoneAstroCalc._6_1_ = 0;
  local_278 = (TimeArrayTimeZoneRule *)0x0;
  if (pTVar2 != (TimeArrayTimeZoneRule *)0x0) {
    local_169 = 1;
    local_168 = pTVar2;
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&status,L"Korean 1912-");
    dangiCalZoneAstroCalc._7_1_ = 1;
    UnicodeString::UnicodeString(&local_1b0,'\x01',(ConstChar16Ptr *)&status,-1);
    dangiCalZoneAstroCalc._6_1_ = 1;
    in_RSI = &local_1b0;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (pTVar2,in_RSI,32400000,0,(UDate *)&initialTimeZone,1,STANDARD_TIME);
    local_278 = pTVar2;
  }
  local_169 = 0;
  if ((dangiCalZoneAstroCalc._6_1_ & 1) != 0) {
    UnicodeString::~UnicodeString(&local_1b0);
  }
  if ((dangiCalZoneAstroCalc._7_1_ & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&status);
  }
  local_160 = local_278;
  dangiCalZoneAstroCalc._0_4_ = U_ZERO_ERROR;
  this_00 = (RuleBasedTimeZone *)UMemory::operator_new((UMemory *)0x70,(size_t)in_RSI);
  local_290 = (RuleBasedTimeZone *)0x0;
  if (this_00 != (RuleBasedTimeZone *)0x0) {
    local_1d1 = 1;
    local_1d0 = this_00;
    ConstChar16Ptr::ConstChar16Ptr(&local_220,L"KOREA_ZONE");
    UnicodeString::UnicodeString(&local_218,'\x01',&local_220,-1);
    RuleBasedTimeZone::RuleBasedTimeZone(this_00,&local_218,local_28);
    local_290 = this_00;
  }
  local_1d1 = 0;
  if (this_00 != (RuleBasedTimeZone *)0x0) {
    UnicodeString::~UnicodeString(&local_218);
    ConstChar16Ptr::~ConstChar16Ptr(&local_220);
  }
  local_1c8 = local_290;
  RuleBasedTimeZone::addTransitionRule
            (local_290,&local_90->super_TimeZoneRule,(UErrorCode *)&dangiCalZoneAstroCalc);
  RuleBasedTimeZone::addTransitionRule
            (local_1c8,&local_f8->super_TimeZoneRule,(UErrorCode *)&dangiCalZoneAstroCalc);
  RuleBasedTimeZone::addTransitionRule
            (local_1c8,&local_160->super_TimeZoneRule,(UErrorCode *)&dangiCalZoneAstroCalc);
  RuleBasedTimeZone::complete(local_1c8,(UErrorCode *)&dangiCalZoneAstroCalc);
  UVar1 = ::U_SUCCESS((UErrorCode)dangiCalZoneAstroCalc);
  if (UVar1 == '\0') {
    if (local_1c8 != (RuleBasedTimeZone *)0x0) {
      (*(local_1c8->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
    }
    gDangiCalendarZoneAstroCalc = (TimeZone *)0x0;
  }
  else {
    gDangiCalendarZoneAstroCalc = (TimeZone *)local_1c8;
  }
  ucln_i18n_registerCleanup_63(UCLN_I18N_DANGI_CALENDAR,calendar_dangi_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initDangiCalZoneAstroCalc(void) {
    U_ASSERT(gDangiCalendarZoneAstroCalc == NULL);
    const UDate millis1897[] = { (UDate)((1897 - 1970) * 365 * kOneDay) }; // some days of error is not a problem here
    const UDate millis1898[] = { (UDate)((1898 - 1970) * 365 * kOneDay) }; // some days of error is not a problem here
    const UDate millis1912[] = { (UDate)((1912 - 1970) * 365 * kOneDay) }; // this doesn't create an issue for 1911/12/20
    InitialTimeZoneRule* initialTimeZone = new InitialTimeZoneRule(UNICODE_STRING_SIMPLE("GMT+8"), 8*kOneHour, 0);
    TimeZoneRule* rule1897 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1897"), 7*kOneHour, 0, millis1897, 1, DateTimeRule::STANDARD_TIME);
    TimeZoneRule* rule1898to1911 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1898-1911"), 8*kOneHour, 0, millis1898, 1, DateTimeRule::STANDARD_TIME);
    TimeZoneRule* ruleFrom1912 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1912-"), 9*kOneHour, 0, millis1912, 1, DateTimeRule::STANDARD_TIME);
    UErrorCode status = U_ZERO_ERROR;
    RuleBasedTimeZone* dangiCalZoneAstroCalc = new RuleBasedTimeZone(UNICODE_STRING_SIMPLE("KOREA_ZONE"), initialTimeZone); // adopts initialTimeZone
    dangiCalZoneAstroCalc->addTransitionRule(rule1897, status); // adopts rule1897
    dangiCalZoneAstroCalc->addTransitionRule(rule1898to1911, status);
    dangiCalZoneAstroCalc->addTransitionRule(ruleFrom1912, status);
    dangiCalZoneAstroCalc->complete(status);
    if (U_SUCCESS(status)) {
        gDangiCalendarZoneAstroCalc = dangiCalZoneAstroCalc;
    } else {
        delete dangiCalZoneAstroCalc;
        gDangiCalendarZoneAstroCalc = NULL;
    }
    ucln_i18n_registerCleanup(UCLN_I18N_DANGI_CALENDAR, calendar_dangi_cleanup);
}